

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_quic_transport_params_add_serverhello_impl
               (SSL_HANDSHAKE *hs,CBB *out,bool use_legacy_codepoint)

{
  bool bVar1;
  int iVar2;
  uchar *data;
  size_t len;
  undefined1 local_58 [8];
  CBB contents;
  uint16_t extension_type;
  bool use_legacy_codepoint_local;
  CBB *out_local;
  SSL_HANDSHAKE *hs_local;
  
  contents.u._31_1_ = use_legacy_codepoint;
  iVar2 = SSL_is_quic(hs->ssl);
  if ((iVar2 == 0) && ((contents.u._31_1_ & 1) != 0)) {
    hs_local._7_1_ = true;
  }
  else {
    iVar2 = SSL_is_quic(hs->ssl);
    if (iVar2 == 0) {
      __assert_fail("SSL_is_quic(hs->ssl)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0xb49,
                    "bool bssl::ext_quic_transport_params_add_serverhello_impl(SSL_HANDSHAKE *, CBB *, bool)"
                   );
    }
    bVar1 = Array<unsigned_char>::empty(&hs->config->quic_transport_params);
    if (bVar1) {
      ERR_put_error(0x10,0,0x131,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0xb4c);
      hs_local._7_1_ = false;
    }
    else if ((contents.u._31_1_ & 1) ==
             ((byte)((ushort)*(undefined2 *)&hs->config->field_0x10d >> 9) & 1)) {
      contents.u._28_2_ = 0x39;
      if ((*(ushort *)&hs->config->field_0x10d >> 9 & 1) != 0) {
        contents.u._28_2_ = 0xffa5;
      }
      iVar2 = CBB_add_u16(out,contents.u._28_2_);
      if ((iVar2 != 0) && (iVar2 = CBB_add_u16_length_prefixed(out,(CBB *)local_58), iVar2 != 0)) {
        data = Array<unsigned_char>::data(&hs->config->quic_transport_params);
        len = Array<unsigned_char>::size(&hs->config->quic_transport_params);
        iVar2 = CBB_add_bytes((CBB *)local_58,data,len);
        if ((iVar2 != 0) && (iVar2 = CBB_flush(out), iVar2 != 0)) {
          return true;
        }
      }
      hs_local._7_1_ = false;
    }
    else {
      hs_local._7_1_ = true;
    }
  }
  return hs_local._7_1_;
}

Assistant:

static bool ext_quic_transport_params_add_serverhello_impl(
    SSL_HANDSHAKE *hs, CBB *out, bool use_legacy_codepoint) {
  if (!SSL_is_quic(hs->ssl) && use_legacy_codepoint) {
    // Ignore the legacy private-use codepoint because that could be sent
    // to mean something else than QUIC transport parameters.
    return true;
  }
  assert(SSL_is_quic(hs->ssl));
  if (hs->config->quic_transport_params.empty()) {
    // Transport parameters must be set when using QUIC.
    OPENSSL_PUT_ERROR(SSL, SSL_R_QUIC_TRANSPORT_PARAMETERS_MISCONFIGURED);
    return false;
  }
  if (use_legacy_codepoint != hs->config->quic_use_legacy_codepoint) {
    // Do nothing, we'll send the other codepoint.
    return true;
  }

  uint16_t extension_type = TLSEXT_TYPE_quic_transport_parameters;
  if (hs->config->quic_use_legacy_codepoint) {
    extension_type = TLSEXT_TYPE_quic_transport_parameters_legacy;
  }

  CBB contents;
  if (!CBB_add_u16(out, extension_type) ||
      !CBB_add_u16_length_prefixed(out, &contents) ||
      !CBB_add_bytes(&contents, hs->config->quic_transport_params.data(),
                     hs->config->quic_transport_params.size()) ||
      !CBB_flush(out)) {
    return false;
  }

  return true;
}